

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64rapass.cpp
# Opt level: O1

Error __thiscall
asmjit::v1_14::a64::RACFGBuilder::onInvoke
          (RACFGBuilder *this,InvokeNode *invokeNode,RAInstBuilder *ib)

{
  BaseRAPass *pBVar1;
  BaseBuilder *pBVar2;
  Environment EVar3;
  uint uVar4;
  Error EVar5;
  Error EVar6;
  long lVar7;
  int iVar8;
  Error in_R9D;
  undefined1 *puVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  bool bVar13;
  char cVar14;
  RAWorkReg *workReg;
  RAWorkReg *local_50;
  RACFGBuilder *local_48;
  RAInstBuilder *local_40;
  ulong local_38;
  
  local_38 = (ulong)(byte)invokeNode->field_0xf4;
  bVar12 = local_38 != 0;
  local_48 = this;
  local_40 = ib;
  if (bVar12) {
    puVar9 = &invokeNode->field_0x11c;
    lVar7 = 4;
    uVar10 = 0;
    do {
      if (uVar10 == 0x20) {
LAB_0013963b:
        onInvoke();
LAB_00139640:
        onInvoke();
        goto LAB_00139645;
      }
      lVar11 = 0;
      do {
        if (*(int *)(puVar9 + lVar11) != 0) {
          if ((byte)invokeNode->field_0xf4 <= (byte)uVar10) {
            onInvoke();
            goto LAB_0013963b;
          }
          uVar4 = *(uint *)((long)invokeNode->_args->_data[0]._data + lVar11 * 4 + lVar7 + -0xc);
          EVar5 = in_R9D;
          if (uVar4 == 0) {
            iVar8 = 7;
          }
          else {
            iVar8 = 0;
            if ((uVar4 & 7) == 1) {
              pBVar1 = (this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
              uVar4 = *(int *)((long)invokeNode->_args->_data[0]._data + lVar11 * 4 + lVar7 + -8) -
                      0x100;
              pBVar2 = (pBVar1->super_FuncPass).super_Pass._cb;
              if (uVar4 < *(uint *)&pBVar2[1].super_BaseEmitter._logger) {
                EVar3 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar4];
                local_50 = *(RAWorkReg **)((long)EVar3 + 0x28);
                EVar5 = 0;
                if (local_50 == (RAWorkReg *)0x0) {
                  EVar5 = BaseRAPass::_asWorkReg(pBVar1,(VirtReg *)EVar3,&local_50);
                  this = local_48;
                }
              }
              else {
                EVar5 = 0x1e;
              }
              iVar8 = 1;
              if (EVar5 == 0) {
                uVar4 = *(uint *)(puVar9 + lVar11);
                if ((uVar4 >> 10 & 1) == 0) {
                  if ((uVar4 >> 8 & 1) != 0) {
                    if (uVar4 < 0x20000000) {
                      bVar13 = true;
                      if (((*(uint *)(_archTraits + (ulong)(uVar4 >> 0x18) * 4 + 0x524) ^
                           *(uint *)(local_50 + 0x20)) & 0xf00) == 0) {
                        EVar5 = RAInstBuilder::addCallArg(local_40,local_50,uVar4 >> 0x10 & 0xff);
                        bVar13 = EVar5 == 0;
                        this = local_48;
                        if (!bVar13) {
                          in_R9D = EVar5;
                        }
                      }
                      goto joined_r0x0013943b;
                    }
                    goto LAB_00139640;
                  }
                }
                else {
                  if (((byte)local_50[0x21] & 0xf) == 0) {
                    EVar5 = RAInstBuilder::addCallArg(local_40,local_50,uVar4 >> 0x10 & 0xff);
                    bVar13 = EVar5 == 0;
                    this = local_48;
                    if (!bVar13) {
                      in_R9D = EVar5;
                    }
                  }
                  else {
                    bVar13 = false;
                    in_R9D = 3;
                  }
joined_r0x0013943b:
                  EVar5 = in_R9D;
                  if (!bVar13) goto LAB_001393dd;
                }
                iVar8 = 0;
                EVar5 = in_R9D;
              }
            }
          }
LAB_001393dd:
          in_R9D = EVar5;
          if ((iVar8 != 7) && (iVar8 != 0)) goto LAB_00139450;
        }
        lVar11 = lVar11 + 4;
      } while (lVar11 != 0x10);
      iVar8 = 5;
LAB_00139450:
      if ((iVar8 != 5) && (iVar8 != 0)) break;
      uVar10 = uVar10 + 1;
      bVar12 = uVar10 < local_38;
      puVar9 = puVar9 + 0x10;
      lVar7 = lVar7 + 0x40;
    } while (uVar10 != local_38);
  }
  if (!bVar12) {
    lVar7 = 199;
    do {
      EVar5 = in_R9D;
      if (*(int *)(&invokeNode->field_0x45 + lVar7) == 0) {
        cVar14 = '\x0e';
      }
      else {
        cVar14 = '\0';
        if ((*(uint *)(&invokeNode->super_InstNodeWithOperands<4U> + lVar7 * 4) & 7) == 1) {
          pBVar1 = (this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
          uVar4 = *(int *)(&invokeNode->field_0x4 + lVar7 * 4) - 0x100;
          pBVar2 = (pBVar1->super_FuncPass).super_Pass._cb;
          if (uVar4 < *(uint *)&pBVar2[1].super_BaseEmitter._logger) {
            EVar3 = (&(pBVar2[1].super_BaseEmitter._code)->_environment)[uVar4];
            local_50 = *(RAWorkReg **)((long)EVar3 + 0x28);
            EVar5 = 0;
            if (local_50 == (RAWorkReg *)0x0) {
              EVar5 = BaseRAPass::_asWorkReg(pBVar1,(VirtReg *)EVar3,&local_50);
              this = local_48;
            }
          }
          else {
            EVar5 = 0x1e;
          }
          cVar14 = '\x01';
          if (EVar5 == 0) {
            uVar4 = *(uint *)(&invokeNode->field_0x45 + lVar7);
            EVar5 = 0x19;
            cVar14 = '\x01';
            if ((uVar4 >> 8 & 1) != 0) {
              if (0x1fffffff < uVar4) {
LAB_00139645:
                onInvoke();
                return 0;
              }
              cVar14 = '\0';
              EVar5 = in_R9D;
              if (((*(uint *)(_archTraits + (ulong)(uVar4 >> 0x18) * 4 + 0x524) ^
                   *(uint *)(local_50 + 0x20)) & 0xf00) == 0) {
                EVar6 = RAInstBuilder::addCallRet(local_40,local_50,uVar4 >> 0x10 & 0xff);
                cVar14 = EVar6 != 0;
                this = local_48;
                if ((bool)cVar14) {
                  EVar5 = EVar6;
                }
              }
            }
          }
        }
      }
      in_R9D = EVar5;
      if (cVar14 != '\0') goto LAB_001395a4;
      lVar7 = lVar7 + 4;
    } while (lVar7 != 0xd7);
    cVar14 = '\x0e';
LAB_001395a4:
    if (cVar14 == '\x0e') {
      pBVar1 = (this->super_RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>)._pass;
      *(uint *)(local_40 + 0x28) =
           ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[0] & 0x3f)) |
            *(uint *)&invokeNode->field_0xa4);
      *(uint *)(local_40 + 0x2c) =
           ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[1] & 0x3f)) |
            *(uint *)&invokeNode->field_0xa8);
      *(uint *)(local_40 + 0x30) =
           ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[2] & 0x3f)) |
            *(uint *)&invokeNode->field_0xac);
      *(uint *)(local_40 + 0x34) =
           ~((uint)(-1L << ((pBVar1->_physRegCount).field_0._regs[3] & 0x3f)) |
            *(uint *)&invokeNode->field_0xb0);
      in_R9D = 0;
    }
  }
  return in_R9D;
}

Assistant:

Error RACFGBuilder::onInvoke(InvokeNode* invokeNode, RAInstBuilder& ib) noexcept {
  uint32_t argCount = invokeNode->argCount();
  const FuncDetail& fd = invokeNode->detail();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        continue;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isIndirect()) {
          RegGroup regGroup = workReg->group();
          if (regGroup != RegGroup::kGp)
            return DebugUtils::errored(kErrorInvalidState);
          ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
        }
        else if (arg.isReg()) {
          RegGroup regGroup = workReg->group();
          RegGroup argGroup = Reg::groupOf(arg.regType());

          if (regGroup == argGroup) {
            ASMJIT_PROPAGATE(ib.addCallArg(workReg, arg.regId()));
          }
        }
      }
    }
  }

  for (uint32_t retIndex = 0; retIndex < Globals::kMaxValuePack; retIndex++) {
    const FuncValue& ret = fd.ret(retIndex);
    if (!ret)
      break;

    const Operand& op = invokeNode->ret(retIndex);
    if (op.isReg()) {
      const Reg& reg = op.as<Reg>();
      RAWorkReg* workReg;
      ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

      if (ret.isReg()) {
        RegGroup regGroup = workReg->group();
        RegGroup retGroup = Reg::groupOf(ret.regType());

        if (regGroup == retGroup) {
          ASMJIT_PROPAGATE(ib.addCallRet(workReg, ret.regId()));
        }
      }
      else {
        return DebugUtils::errored(kErrorInvalidAssignment);
      }
    }
  }

  // Setup clobbered registers.
  ib._clobbered[0] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(0)]) & ~fd.preservedRegs(RegGroup(0));
  ib._clobbered[1] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(1)]) & ~fd.preservedRegs(RegGroup(1));
  ib._clobbered[2] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(2)]) & ~fd.preservedRegs(RegGroup(2));
  ib._clobbered[3] = Support::lsbMask<RegMask>(_pass->_physRegCount[RegGroup(3)]) & ~fd.preservedRegs(RegGroup(3));

  return kErrorOk;
}